

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O2

RangeList * __thiscall
SoapySDR::Device::getFrequencyRange
          (RangeList *__return_storage_ptr__,Device *this,int dir,size_t chan)

{
  pointer pRVar1;
  ulong uVar2;
  long lVar3;
  double *pdVar4;
  size_t range_i;
  ulong uVar5;
  double extraout_XMM0_Qa;
  double dVar6;
  double dVar7;
  RangeList subRange;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comps;
  Range local_48;
  
  (*this->_vptr_Device[0x3b])(&comps);
  if (comps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      comps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (*this->_vptr_Device[0x3d])(__return_storage_ptr__,this,(ulong)(uint)dir,chan);
    (*this->_vptr_Device[0x44])(this,(ulong)(uint)dir,chan);
    for (uVar2 = 1;
        uVar2 < (ulong)((long)comps.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)comps.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
      (*this->_vptr_Device[0x3d])
                (&subRange,this,(ulong)(uint)dir,chan,
                 comps.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar2);
      if (subRange.super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>._M_impl.
          super__Vector_impl_data._M_start !=
          subRange.super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        dVar7 = (subRange.super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>.
                 _M_impl.super__Vector_impl_data._M_start)->_min;
        if (extraout_XMM0_Qa <= 0.0) {
          dVar6 = subRange.super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1]._max;
        }
        else {
          if (dVar7 <= extraout_XMM0_Qa * -0.5) {
            dVar7 = extraout_XMM0_Qa * -0.5;
          }
          dVar6 = subRange.super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1]._max;
          if (extraout_XMM0_Qa * 0.5 <=
              subRange.super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>._M_impl
              .super__Vector_impl_data._M_finish[-1]._max) {
            dVar6 = extraout_XMM0_Qa * 0.5;
          }
        }
        lVar3 = 0;
        for (uVar5 = 0;
            pRVar1 = (__return_storage_ptr__->
                     super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>)._M_impl.
                     super__Vector_impl_data._M_start,
            uVar5 < (ulong)(((long)(__return_storage_ptr__->
                                   super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) /
                           0x18); uVar5 = uVar5 + 1) {
          Range::Range(&local_48,*(double *)((long)&pRVar1->_min + lVar3) + dVar7,
                       *(double *)((long)&pRVar1->_max + lVar3) + dVar6,0.0);
          pdVar4 = (double *)((long)&pRVar1->_min + lVar3);
          pdVar4[2] = local_48._step;
          *pdVar4 = local_48._min;
          pdVar4[1] = local_48._max;
          lVar3 = lVar3 + 0x18;
        }
      }
      std::_Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::~_Vector_base
                (&subRange.super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&comps);
  return __return_storage_ptr__;
}

Assistant:

SoapySDR::RangeList SoapySDR::Device::getFrequencyRange(const int dir, const size_t chan) const
{
    //get a list of tunable components
    const auto comps = this->listFrequencies(dir, chan);
    if (comps.empty()) return SoapySDR::RangeList();

    //get the range list for the RF component
    auto ranges = this->getFrequencyRange(dir, chan, comps.front());

    //use bandwidth setting to clip the range
    const double bw = this->getBandwidth(dir, chan);

    //add to the range list given subsequent components
    for (size_t comp_i = 1; comp_i < comps.size(); comp_i++)
    {
        const auto subRange = this->getFrequencyRange(dir, chan, comps[comp_i]);
        if (subRange.empty()) continue;

        double subRangeLow = subRange.front().minimum();
        if (bw > 0.0) subRangeLow = std::max(-bw/2, subRangeLow);

        double subRangeHigh = subRange.back().maximum();
        if (bw > 0.0) subRangeHigh = std::min(bw/2, subRangeHigh);

        for (size_t range_i = 0; range_i < ranges.size(); range_i++)
        {
            SoapySDR::Range &range = ranges[range_i];
            range = SoapySDR::Range(
                range.minimum() + subRangeLow,
                range.maximum() + subRangeHigh);
        }
    }

    return ranges;
}